

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QAsn1Element>::moveAppend
          (QGenericArrayOps<QAsn1Element> *this,QAsn1Element *b,QAsn1Element *e)

{
  QAsn1Element *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QAsn1Element *in_RDI;
  QAsn1Element *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QAsn1Element>::begin((QArrayDataPointer<QAsn1Element> *)0x123cb7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QAsn1Element::QAsn1Element(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->mValue).d.ptr = (in_RDI->mValue).d.ptr + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }